

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

bool __thiscall Js::InlinedFrameWalker::Next(InlinedFrameWalker *this,CallInfo *callInfo)

{
  InlinedFrame *pIVar1;
  InlinedFrame *currentFrame;
  CallInfo *callInfo_local;
  InlinedFrameWalker *this_local;
  
  MoveNext(this);
  pIVar1 = GetCurrentFrame(this);
  if (pIVar1 != (InlinedFrame *)0x0) {
    *callInfo = (CallInfo)((ulong)*callInfo & 0xffffffff00ffffff);
    *callInfo = (CallInfo)
                ((ulong)*callInfo & 0xffffffffff000000 |
                (ulong)(*(uint *)&(pIVar1->super_InlinedFrameLayout).callInfo & 0xf));
  }
  return pIVar1 != (InlinedFrame *)0x0;
}

Assistant:

bool InlinedFrameWalker::Next(CallInfo& callInfo)
    {
        MoveNext();
        InlinedFrameWalker::InlinedFrame *const currentFrame = GetCurrentFrame();
        if (currentFrame)
        {
            callInfo.Flags = CallFlags_None;
            callInfo.Count = (currentFrame->callInfo.Count & 0xFFFF);
        }

        return currentFrame != nullptr;
    }